

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_X86.cpp
# Opt level: O1

void __thiscall ExecutorX86::ClearBreakpoints(ExecutorX86 *this)

{
  uint uVar1;
  Breakpoint *pBVar2;
  uchar *puVar3;
  long lVar4;
  
  if ((this->breakInstructions).count != 0) {
    lVar4 = 0;
    do {
      pBVar2 = (this->breakInstructions).data;
      uVar1 = pBVar2[lVar4].instIndex;
      if ((this->instAddress).count <= uVar1) {
        __assert_fail("index < count",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x7f,
                      "T &FastVector<unsigned char *>::operator[](unsigned int) [T = unsigned char *, zeroNewMemory = false, skipConstructor = false]"
                     );
      }
      puVar3 = (this->instAddress).data[uVar1];
      if (*puVar3 == 0xcc) {
        *puVar3 = pBVar2[lVar4].oldOpcode;
      }
      lVar4 = lVar4 + 1;
    } while ((uint)lVar4 < (this->breakInstructions).count);
  }
  (this->breakInstructions).count = 0;
  return;
}

Assistant:

void ExecutorX86::ClearBreakpoints()
{
	for(unsigned i = 0; i < breakInstructions.size(); i++)
	{
		if(*instAddress[breakInstructions[i].instIndex] == 0xcc)
			*instAddress[breakInstructions[i].instIndex] = breakInstructions[i].oldOpcode;
	}
	breakInstructions.clear();
}